

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O1

void TasDREAM::SampleDREAM<(TasDREAM::TypeSamplingForm)1>
               (int num_burnup,int num_collect,DreamPDF *probability_distribution,
               DreamDomain *inside,TasmanianDREAM *state,
               function<void_(std::vector<double,_std::allocator<double>_>_&)> *independent_update,
               function<double_()> *differential_update,function<double_()> *get_random01)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  ulong uVar5;
  runtime_error *this;
  vector *pvVar6;
  long lVar7;
  vector *pvVar8;
  int iVar9;
  vector *pvVar10;
  ulong uVar11;
  double *pdVar12;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> candidates;
  vector<double,_std::allocator<double>_> values;
  vector<bool,_std::allocator<bool>_> valid;
  vector<double,_std::allocator<double>_> new_values;
  unsigned_long __n2;
  int local_1b0;
  allocator_type local_1a9;
  vector<double,_std::allocator<double>_> local_1a8;
  int local_18c;
  TasmanianDREAM *local_188;
  vector *local_180;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_158;
  ulong local_140;
  long local_138;
  long local_130;
  double local_128;
  int local_11c;
  vector<bool,_std::allocator<bool>_> local_118;
  void *local_f0 [2];
  long local_e0;
  pointer local_d8;
  _Any_data *local_c0;
  size_type local_b8;
  vector *local_b0;
  long local_a8;
  ulong local_a0;
  vector *local_98;
  ulong local_90;
  _Any_data *local_88;
  _Any_data *local_80;
  size_t local_78;
  double local_70;
  double local_68;
  double dStack_60;
  _Any_data local_50;
  code *local_40;
  
  uVar5 = *(ulong *)state;
  if ((uVar5 & 0xffffffff) != 0) {
    local_18c = num_burnup;
    local_140 = uVar5;
    local_c0 = (_Any_data *)probability_distribution;
    if (state[0x10] == (TasmanianDREAM)0x0) {
LAB_0010adc9:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM."
                );
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_138 = *(long *)(state + 8);
    if (state[0x11] == (TasmanianDREAM)0x0) {
      std::
      function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
      ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                  *)&local_50,probability_distribution);
      TasDREAM::TasmanianDREAM::setPDFvalues(state,&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
    if (0 < num_collect) {
      TasDREAM::TasmanianDREAM::expandHistory((int)state);
    }
    local_11c = 0;
    if (0 < local_18c) {
      local_11c = local_18c;
    }
    if (num_collect < 1) {
      num_collect = 0;
    }
    local_11c = num_collect + local_11c;
    if (local_11c != 0) {
      iVar9 = (int)uVar5;
      local_180 = (vector *)(long)iVar9;
      auVar15._8_4_ = iVar9 >> 0x1f;
      auVar15._0_8_ = local_180;
      auVar15._12_4_ = 0x45300000;
      dStack_60 = auVar15._8_8_ - 1.9342813113834067e+25;
      local_140 = local_140 << 0x20;
      local_90 = (ulong)(int)local_138;
      local_68 = dStack_60 + ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0);
      local_b8 = local_90 * (long)local_180;
      local_78 = (local_138 << 0x20) >> 0x1d;
      local_98 = local_180 + (local_180 == (vector *)0x0);
      local_b0 = local_180 + -1;
      local_a0 = 0x800000000000003f;
      local_1b0 = 0;
      local_188 = state;
      local_138 = local_138 << 0x20;
      local_88 = (_Any_data *)independent_update;
      local_80 = (_Any_data *)inside;
      do {
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (double *)0x0;
        local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::reserve(&local_178,local_b8);
        pvVar8 = local_180;
        std::vector<double,_std::allocator<double>_>::reserve(&local_158,(size_type)local_180);
        local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 1;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_118,(size_type)pvVar8,(bool *)&local_1a8,(allocator_type *)local_f0);
        if (local_140 != 0) {
          pvVar8 = (vector *)0x0;
          do {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_1a8,local_90,(allocator_type *)local_f0);
            if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010adba:
              std::__throw_bad_function_call();
              goto LAB_0010adbf;
            }
            local_d8 = (pointer)(*get_random01->_M_invoker)((_Any_data *)get_random01);
            if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010adb5:
              std::__throw_bad_function_call();
              goto LAB_0010adba;
            }
            dVar14 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
            uVar5 = (ulong)((double)local_d8 * local_68);
            pvVar6 = (vector *)
                     ((long)((double)local_d8 * local_68 - 9.223372036854776e+18) &
                      (long)uVar5 >> 0x3f | uVar5);
            if (local_180 <= pvVar6) {
              pvVar6 = local_b0;
            }
            uVar5 = (ulong)(dVar14 * local_68);
            pvVar10 = (vector *)
                      ((long)(dVar14 * local_68 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f |
                      uVar5);
            if (local_180 <= pvVar10) {
              pvVar6 = local_b0;
            }
            if ((differential_update->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_0010adb5;
            dVar14 = (*differential_update->_M_invoker)((_Any_data *)differential_update);
            TasDREAM::TasmanianDREAM::getIJKdelta
                      ((ulong)state,(ulong)pvVar8,(ulong)pvVar6,dVar14,pvVar10);
            if ((*(long *)((long)independent_update + 0x10) == 0) ||
               ((**(code **)((long)independent_update + 0x18))
                          ((_Any_data *)independent_update,&local_1a8),
               *(long *)((long)inside + 0x10) == 0)) goto LAB_0010adb5;
            bVar4 = (**(code **)((long)inside + 0x18))((_Any_data *)inside,&local_1a8);
            if (bVar4) {
              std::vector<double,std::allocator<double>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        ((vector<double,std::allocator<double>> *)&local_178,
                         local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_1_),
                         local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::vector<double,_std::allocator<double>_>::resize
                        (&local_158,
                         ((long)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
            }
            else {
              pvVar6 = pvVar8 + 0x3f;
              if (-1 < (long)pvVar8) {
                pvVar6 = pvVar8;
              }
              bVar2 = (byte)pvVar8 & 0x3f;
              local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)pvVar6 >> 6) + ((ulong)(((ulong)pvVar8 & local_a0) < 0x8000000000000001) - 1)]
                   = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)pvVar6 >> 6) +
                      ((ulong)(((ulong)pvVar8 & local_a0) < 0x8000000000000001) - 1)] &
                     (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
            }
            pvVar3 = (void *)CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._1_7_,
                                      local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_1_);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,(long)local_1a8.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar3);
            }
            pvVar8 = pvVar8 + 1;
          } while (local_98 != pvVar8);
        }
        if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if (*(long *)(local_c0 + 1) != 0) {
            (**(code **)((long)local_c0 + 0x18))(local_c0,&local_178,&local_158);
            goto LAB_0010aa5b;
          }
LAB_0010adc4:
          std::__throw_bad_function_call();
          goto LAB_0010adc9;
        }
LAB_0010aa5b:
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_1a8,local_b8,(allocator_type *)local_f0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_f0,(size_type)local_180,
                   &local_1a9);
        if (local_140 != 0) {
          local_d8 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_a8 = 0;
          lVar7 = 0;
          pvVar8 = (vector *)0x0;
          local_130 = 0;
          pdVar12 = local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
LAB_0010aabc:
          pvVar6 = pvVar8 + 0x3f;
          if (-1 < (long)pvVar8) {
            pvVar6 = pvVar8;
          }
          uVar11 = (ulong)(((ulong)pvVar8 & local_a0) < 0x8000000000000001);
          uVar5 = 1L << ((byte)pvVar8 & 0x3f);
          bVar13 = (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)pvVar6 >> 6) + (uVar11 - 1)] & uVar5) == 0;
          bVar4 = !bVar13;
          if (bVar13) {
LAB_0010ab7f:
            if (bVar4) goto LAB_0010ab83;
            lVar1 = *(long *)(local_188 + 8);
            if (lVar1 != 0) {
              memmove((void *)(lVar7 * 8 +
                              CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_1a8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_)),
                      (void *)((local_a8 >> 0x20) * lVar1 * 8 + *(long *)(local_188 + 0x20)),
                      lVar1 << 3);
            }
            *(undefined8 *)((long)local_f0[0] + (long)pvVar8 * 8) =
                 *(undefined8 *)(*(long *)(local_188 + 0x50) + (long)pvVar8 * 8);
LAB_0010ac23:
            uVar5 = uVar5 & local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [((long)pvVar6 >> 6) + (uVar11 - 1)];
            pdVar12 = pdVar12 + (uVar5 != 0);
            if (uVar5 != 0) {
              uVar5 = local_90;
            }
            local_d8 = local_d8 + uVar5;
            pvVar8 = pvVar8 + 1;
            lVar7 = lVar7 + local_90;
            local_a8 = local_a8 + 0x100000000;
            if (local_98 == pvVar8) goto LAB_0010ac94;
            goto LAB_0010aabc;
          }
          local_128 = *pdVar12;
          local_70 = *(double *)(*(long *)(local_188 + 0x50) + (long)pvVar8 * 8);
          if (local_70 < local_128) {
LAB_0010ab83:
            if (local_138 != 0) {
              memmove((void *)(lVar7 * 8 +
                              CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_1a8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_)),local_d8,
                      local_78);
            }
            *(double *)((long)local_f0[0] + (long)pvVar8 * 8) = *pdVar12;
            local_130 = local_130 + 1;
            goto LAB_0010ac23;
          }
          if ((get_random01->super__Function_base)._M_manager != (_Manager_type)0x0) {
            dVar14 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
            local_128 = local_128 - local_70;
            dVar14 = log(dVar14);
            bVar4 = dVar14 <= local_128;
            goto LAB_0010ab7f;
          }
LAB_0010adbf:
          std::__throw_bad_function_call();
          goto LAB_0010adc4;
        }
        local_130 = 0;
LAB_0010ac94:
        state = local_188;
        TasDREAM::TasmanianDREAM::setState((vector *)local_188);
        inside = (DreamDomain *)local_80;
        TasDREAM::TasmanianDREAM::setPDFvalues((vector *)state);
        if (local_18c <= local_1b0) {
          TasDREAM::TasmanianDREAM::saveStateHistory((ulong)state);
        }
        independent_update =
             (function<void_(std::vector<double,_std::allocator<double>_>_&)> *)local_88;
        iVar9 = local_11c;
        if (local_f0[0] != (void *)0x0) {
          operator_delete(local_f0[0],local_e0 - (long)local_f0[0]);
        }
        pvVar3 = (void *)CONCAT71(local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_1a8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_1_);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_1a8.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar3);
        }
        if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != iVar9);
    }
  }
  return;
}

Assistant:

void SampleDREAM(int num_burnup, int num_collect,
                 DreamPDF probability_distribution,
                 DreamDomain inside,
                 TasmanianDREAM &state,
                 std::function<void(std::vector<double> &x)> independent_update = no_update,
                 std::function<double(void)> differential_update = const_one,
                 std::function<double(void)> get_random01 = tsgCoreUniform01){

    size_t num_chains = (size_t) state.getNumChains(), num_dimensions = (size_t) state.getNumDimensions();
    double unitlength = (double) num_chains;

    if (num_chains == 0) return; // no sampling with a null state

    if (!state.isStateReady()) throw std::runtime_error("ERROR: DREAM sampling requires that the setState() has been called first on the TasmanianDREAM.");

    if (!state.isPDFReady()) // initialize probability density (if not initialized already)
        state.setPDFvalues(probability_distribution);

    if (num_collect > 0) // pre-allocate memory for the new history
        state.expandHistory(num_collect);

    int total_iterations = std::max(num_burnup, 0) + std::max(num_collect, 0);
    for(int t = 0; t < total_iterations; t++){
        std::vector<double> candidates, values;
        candidates.reserve(num_chains * num_dimensions);
        values.reserve(num_chains);

        std::vector<bool> valid(num_chains, true); // keep track whether the samples need to be evaluated

        for(size_t i=0; i<num_chains; i++){
            std::vector<double> propose(num_dimensions);

            size_t jindex = (size_t) (get_random01() * unitlength);
            size_t kindex = (size_t) (get_random01() * unitlength);
            if (jindex >= num_chains) jindex = num_chains - 1; // this is needed in case get_random01() returns 1
            if (kindex >= num_chains) jindex = num_chains - 1;

            state.getIJKdelta(i, jindex, kindex, differential_update(), propose); // propose = s_i + w ( s_k - s_j)
            independent_update(propose); // propose += correction

            if (inside(propose)){
                candidates.insert(candidates.end(), propose.begin(), propose.end());
                values.resize(values.size() + 1);
            }else{
                valid[i] = false;
            }
        }

        if (!candidates.empty()) // block the pathological case of all proposals leaving the domain
            probability_distribution(candidates, values);

        std::vector<double> new_state(num_chains * num_dimensions), new_values(num_chains);

        auto icand = candidates.begin(); // loop over all candidates and values, accept or reject
        auto ival = values.begin();

        size_t accepted = 0;

        for(size_t i=0; i<num_chains; i++){
            bool keep_new = valid[i]; // if not valid, automatically reject
            if (valid[i]){ // apply random test
                if (*ival > state.getPDFvalue(i)){ // if the new value has higher probability, automatically accept
                    keep_new = true;
                }else{
                    if (form == regform){
                        keep_new = (*ival / state.getPDFvalue(i) >= get_random01()); // keep if the new value has higher probability
                    }else{
                        keep_new = (*ival - state.getPDFvalue(i) >= log(get_random01()));
                    }
                    //std::cout << "Trsh = " << *ival / state.getPDFvalue(i) << "   " << ((keep_new) ? "Accept" : "Reject") << std:: endl;
                }
            }

            if (keep_new){
                std::copy_n(icand, num_dimensions, new_state.begin() + i * num_dimensions);
                new_values[i] = *ival;
                accepted++; // accepted one more proposal
            }else{ // reject and reuse the old state
                state.getChainState((int) i, &*(new_state.begin() + i * num_dimensions));
                new_values[i] = state.getPDFvalue(i);
            }

            if (valid[i]){ // kept or rejected, if this sample was valid then move to the next sample in the list
                std::advance(icand, num_dimensions);
                ival++;
            }
        }

        state.setState(new_state);
        state.setPDFvalues(new_values);

        if (t >= num_burnup)
            state.saveStateHistory(accepted);
    }
}